

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm1394.cpp
# Opt level: O1

bool PromProgramCallback(char *msg)

{
  ostream *poVar1;
  size_t sVar2;
  double dVar3;
  
  if (msg == (char *)0x0) {
    dVar3 = Amp1394_GetTime();
    if (0.1 < dVar3 - Callback_StartTime) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      std::ostream::flush();
      Callback_StartTime = dVar3;
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar1 = (ostream *)std::ostream::flush();
    sVar2 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,msg,sVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return true;
}

Assistant:

bool PromProgramCallback(const char *msg)
{
    if (msg) std::cout << std::endl << msg << std::endl;
    else {
        double t = Amp1394_GetTime();
        if ((t - Callback_StartTime) > 0.1) {
            std::cout << "." << std::flush;
            Callback_StartTime = t;
        }
    }
    return true;   // continue
}